

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuVfsShmMap(sqlite3_file *pFile,int iRegion,int szRegion,int isWrite,void **pp)

{
  sqlite3_io_methods *psVar1;
  void *__s;
  int local_54;
  char *pNew;
  char **apNew;
  sqlite3_int64 nByte;
  int eStage;
  int rc;
  rbu_file *p;
  void **pp_local;
  int isWrite_local;
  int szRegion_local;
  int iRegion_local;
  sqlite3_file *pFile_local;
  
  nByte._4_4_ = 0;
  if (pFile[3].pMethods == (sqlite3_io_methods *)0x0) {
    local_54 = 0;
  }
  else {
    local_54 = (pFile[3].pMethods)->iVersion;
  }
  if ((local_54 == 1) || (local_54 == 2)) {
    if (iRegion <= *(int *)((long)&pFile[6].pMethods + 4)) {
      psVar1 = (sqlite3_io_methods *)sqlite3_realloc64(pFile[7].pMethods,(long)(iRegion + 1) << 3);
      if (psVar1 == (sqlite3_io_methods *)0x0) {
        nByte._4_4_ = 7;
      }
      else {
        memset(&psVar1->iVersion + (long)*(int *)((long)&pFile[6].pMethods + 4) * 2,0,
               (long)((iRegion + 1) - *(int *)((long)&pFile[6].pMethods + 4)) << 3);
        pFile[7].pMethods = psVar1;
        *(int *)((long)&pFile[6].pMethods + 4) = iRegion + 1;
      }
    }
    if ((nByte._4_4_ == 0) && (*(long *)(&(pFile[7].pMethods)->iVersion + (long)iRegion * 2) == 0))
    {
      __s = sqlite3_malloc64((long)szRegion);
      if (__s == (void *)0x0) {
        nByte._4_4_ = 7;
      }
      else {
        memset(__s,0,(long)szRegion);
        *(void **)(&(pFile[7].pMethods)->iVersion + (long)iRegion * 2) = __s;
      }
    }
    if (nByte._4_4_ == 0) {
      *pp = *(void **)(&(pFile[7].pMethods)->iVersion + (long)iRegion * 2);
    }
    else {
      *pp = (void *)0x0;
    }
  }
  else {
    nByte._4_4_ = (**(code **)(*(long *)pFile[1].pMethods + 0x68))
                            (pFile[1].pMethods,iRegion,szRegion,isWrite,pp);
  }
  return nByte._4_4_;
}

Assistant:

static int rbuVfsShmMap(
  sqlite3_file *pFile, 
  int iRegion, 
  int szRegion, 
  int isWrite, 
  void volatile **pp
){
  rbu_file *p = (rbu_file*)pFile;
  int rc = SQLITE_OK;
  int eStage = (p->pRbu ? p->pRbu->eStage : 0);

  /* If not in RBU_STAGE_OAL, allow this call to pass through. Or, if this
  ** rbu is in the RBU_STAGE_OAL state, use heap memory for *-shm space 
  ** instead of a file on disk.  */
  assert( p->openFlags & (SQLITE_OPEN_MAIN_DB|SQLITE_OPEN_TEMP_DB) );
  if( eStage==RBU_STAGE_OAL || eStage==RBU_STAGE_MOVE ){
    if( iRegion<=p->nShm ){
      sqlite3_int64 nByte = (iRegion+1) * sizeof(char*);
      char **apNew = (char**)sqlite3_realloc64(p->apShm, nByte);
      if( apNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(&apNew[p->nShm], 0, sizeof(char*) * (1 + iRegion - p->nShm));
        p->apShm = apNew;
        p->nShm = iRegion+1;
      }
    }

    if( rc==SQLITE_OK && p->apShm[iRegion]==0 ){
      char *pNew = (char*)sqlite3_malloc64(szRegion);
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pNew, 0, szRegion);
        p->apShm[iRegion] = pNew;
      }
    }

    if( rc==SQLITE_OK ){
      *pp = p->apShm[iRegion];
    }else{
      *pp = 0;
    }
  }else{
    assert( p->apShm==0 );
    rc = p->pReal->pMethods->xShmMap(p->pReal, iRegion, szRegion, isWrite, pp);
  }

  return rc;
}